

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerator.cpp
# Opt level: O2

string * __thiscall
CodeGenerator::generate_c_code_abi_cxx11_(string *__return_storage_ptr__,CodeGenerator *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,
                 "// Generated by program-homework-solver\n\n#include <stdio.h>\n\nint f(int x){\n\tint answer = "
                 ,&this->func);
  std::operator+(__return_storage_ptr__,&local_30,
                 ";\n\treturn answer;\n}\n\nvoid main(){\n\n\tfor(int i=0; i<20; i++){\n\t\tprintf(\"%d \",f(i));\n\t}\n}"
                );
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string CodeGenerator::generate_c_code() {
    string code =
            "// Generated by program-homework-solver\n\n"
            "#include <stdio.h>"
            "\n\n"
            "int f(int x){\n"
            "\tint answer = " + CodeGenerator::func + ";\n"
            "\treturn answer;\n"
            "}\n\n"
            "void main(){"
            "\n\n"
            "\tfor(int i=0; i<20; i++){\n"
            "\t\tprintf(\"%d \",f(i));\n"
            "\t}\n"
            "}";


    return code;
}